

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall dlib::image_window::image_window(image_window *this)

{
  long *in_RDI;
  bool in_stack_0000001e;
  bool in_stack_0000001f;
  drawable_window *in_stack_00000020;
  drawable_window *in_stack_00000048;
  image_display *in_stack_00000050;
  image_window *in_stack_00000058;
  image_display *in_stack_00000060;
  vector<long,_2L> *in_stack_ffffffffffffffc0;
  rmutex *in_stack_ffffffffffffffd8;
  rsignaler *in_stack_ffffffffffffffe0;
  image_display *this_00;
  
  drawable_window::drawable_window(in_stack_00000020,in_stack_0000001f,in_stack_0000001e);
  *in_RDI = (long)&PTR__image_window_0055c160;
  image_display::image_display(in_stack_00000050,in_stack_00000048);
  rectangle::rectangle((rectangle *)(in_RDI + 0x3ae));
  rectangle::rectangle((rectangle *)(in_RDI + 0x3b2));
  *(undefined1 *)(in_RDI + 0x3b6) = 0;
  *(undefined1 *)((long)in_RDI + 0x1db1) = 0;
  vector<long,_2L>::vector(in_stack_ffffffffffffffc0);
  in_RDI[0x3b9] = 0;
  rsignaler::rsignaler(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined1 *)(in_RDI + 0x3cc) = 0;
  this_00 = (image_display *)0x0;
  image_display::set_image_clicked_handler<dlib::image_window>
            (in_stack_00000060,in_stack_00000058,(offset_in_image_window_to_subr)in_stack_00000048);
  image_display::disable_overlay_editing(this_00);
  (**(code **)(*in_RDI + 0x10))();
  return;
}

Assistant:

image_window::
    image_window(
    ) :
        gui_img(*this),
        window_has_closed(false),
        have_last_click(false),
        mouse_btn(0),
        clicked_signaler(this->wm),
        tie_input_events(false)
    {

        gui_img.set_image_clicked_handler(*this, &image_window::on_image_clicked);
        gui_img.disable_overlay_editing();
        // show this window on the screen
        show();
    }